

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O3

void Omega_h::subtract_from<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  const_iterator __position;
  
  p_Var3 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    p_Var1 = &(a->_M_t)._M_impl.super__Rb_tree_header;
    do {
      p_Var4 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        _Var2 = p_Var3[1]._M_color;
        __position._M_node = &p_Var1->_M_header;
        do {
          if ((int)_Var2 <= (int)p_Var4[1]._M_color) {
            __position._M_node = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)_Var2];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           ((int)__position._M_node[1]._M_color <= (int)_Var2)) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)a,__position);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return;
}

Assistant:

void subtract_from(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) {
    auto it = a.find(x);
    if (it == a.end()) continue;
    a.erase(it);
  }
}